

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O0

void tclpkcs11_unloadall(ClientData cd)

{
  char *pcVar1;
  undefined1 local_40 [8];
  Tcl_HashSearch search;
  Tcl_HashEntry *tcl_handle_entry;
  tclpkcs11_handle *handle;
  tclpkcs11_interpdata *interpdata;
  ClientData cd_local;
  
  if (cd != (ClientData)0x0) {
    search.nextEntryPtr =
         (*tclStubsPtr->tcl_FirstHashEntry)((Tcl_HashTable *)cd,(Tcl_HashSearch *)local_40);
    while (search.nextEntryPtr != (Tcl_HashEntry *)0x0) {
      pcVar1 = (char *)(search.nextEntryPtr)->clientData;
      if ((*(long *)(pcVar1 + 8) != 0) && (*(long *)(*(long *)(pcVar1 + 8) + 0x10) != 0)) {
        (**(code **)(*(long *)(pcVar1 + 8) + 0x10))(0);
      }
      tclpkcs11_int_unload_module(*(void **)pcVar1);
      (*tclStubsPtr->tcl_Free)(pcVar1);
      search.nextEntryPtr = (*tclStubsPtr->tcl_NextHashEntry)((Tcl_HashSearch *)local_40);
    }
  }
  return;
}

Assistant:

MODULE_SCOPE void tclpkcs11_unloadall(ClientData cd) {
  struct tclpkcs11_interpdata *interpdata;
  struct tclpkcs11_handle *handle;
  Tcl_HashEntry *tcl_handle_entry;
  Tcl_HashSearch search;

  if (!cd) {
    return;
  }

  interpdata = (struct tclpkcs11_interpdata *) cd;

  for (
  tcl_handle_entry = Tcl_FirstHashEntry(&interpdata->handles, &search);
  tcl_handle_entry;
  tcl_handle_entry = Tcl_NextHashEntry(&search)
  ) {

    handle = (struct tclpkcs11_handle *) Tcl_GetHashValue(tcl_handle_entry);

    if (handle->pkcs11 && handle->pkcs11->C_Finalize) {
      handle->pkcs11->C_Finalize(NULL);
    }

    tclpkcs11_int_unload_module(handle->base);

    ckfree((char *) handle);

  }

  return;
}